

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O3

void __thiscall hgdb::json::SymbolTable::compress_var(SymbolTable *this)

{
  __node_base_ptr *this_00;
  pointer puVar1;
  reference pvVar2;
  long *plVar3;
  unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_> *m;
  pointer puVar4;
  undefined1 local_120 [8];
  unordered_map<hgdb::json::Variable,_unsigned_long,_hgdb::json::Variable::hash_fn,_std::equal_to<hgdb::json::Variable>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>_>
  ids;
  VarAssign var_assign;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8 [2];
  ulong local_90;
  ScopeVisitor local_88;
  VariableCount v_count;
  unsigned_long local_40;
  size_type id;
  
  id = (size_type)&PTR_handle_002aa808;
  local_88._vptr_ScopeVisitor = (_func_int **)&PTR_handle_002aa808;
  v_count.super_ScopeVisitor._vptr_ScopeVisitor =
       (_func_int **)&v_count.count._M_h._M_rehash_policy._M_next_resize;
  v_count.count._M_h._M_buckets = (__buckets_ptr)0x1;
  v_count.count._M_h._M_bucket_count = 0;
  v_count.count._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  v_count.count._M_h._M_element_count._0_4_ = 0x3f800000;
  v_count.count._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  v_count.count._M_h._M_rehash_policy._4_4_ = 0;
  v_count.count._M_h._M_rehash_policy._M_next_resize = 0;
  puVar4 = (this->modules_).
           super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->modules_).
           super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 != puVar1) {
    do {
      ScopeVisitor::visit(&local_88,
                          (ScopeBase *)
                          (puVar4->_M_t).
                          super___uniq_ptr_impl<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_hgdb::json::Module_*,_std::default_delete<hgdb::json::Module>_>
                          .super__Head_base<0UL,_hgdb::json::Module_*,_false>._M_head_impl);
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar1);
  }
  v_count.count._M_h._M_single_bucket = (__node_base_ptr)&this->variables_;
  std::vector<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>::reserve
            ((vector<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_> *)
             v_count.count._M_h._M_single_bucket,
             (size_type)v_count.count._M_h._M_before_begin._M_nxt);
  local_120 = (undefined1  [8])&ids._M_h._M_rehash_policy._M_next_resize;
  ids._M_h._M_buckets = (__buckets_ptr)0x1;
  ids._M_h._M_bucket_count = 0;
  ids._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ids._M_h._M_element_count._0_4_ = 0x3f800000;
  ids._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  ids._M_h._M_rehash_policy._4_4_ = 0;
  ids._M_h._M_rehash_policy._M_next_resize = 0;
  if (v_count.count._M_h._M_bucket_count != 0) {
    this_00 = &ids._M_h._M_single_bucket;
    plVar3 = (long *)v_count.count._M_h._M_bucket_count;
    do {
      std::pair<const_hgdb::json::Variable,_unsigned_long>::pair
                ((pair<const_hgdb::json::Variable,_unsigned_long> *)this_00,
                 (pair<const_hgdb::json::Variable,_unsigned_long> *)(plVar3 + 1));
      if (1 < local_90) {
        local_40 = ((long)(this->variables_).
                          super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->variables_).
                          super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
        pvVar2 = std::vector<hgdb::json::Variable,std::allocator<hgdb::json::Variable>>::
                 emplace_back<hgdb::json::Variable_const&>
                           ((vector<hgdb::json::Variable,std::allocator<hgdb::json::Variable>> *)
                            v_count.count._M_h._M_single_bucket,(Variable *)this_00);
        (pvVar2->id).super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_40;
        (pvVar2->id).super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged = true;
        std::
        _Hashtable<hgdb::json::Variable,std::pair<hgdb::json::Variable_const,unsigned_long>,std::allocator<std::pair<hgdb::json::Variable_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<hgdb::json::Variable>,hgdb::json::Variable::hash_fn,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<hgdb::json::Variable&,unsigned_long&>
                  ((_Hashtable<hgdb::json::Variable,std::pair<hgdb::json::Variable_const,unsigned_long>,std::allocator<std::pair<hgdb::json::Variable_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<hgdb::json::Variable>,hgdb::json::Variable::hash_fn,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)local_120,pvVar2,&local_40);
      }
      if (local_c8 != local_b8) {
        operator_delete(local_c8,local_b8[0]._M_allocated_capacity + 1);
      }
      if (ids._M_h._M_single_bucket != (__node_base_ptr)&var_assign.id_) {
        operator_delete(ids._M_h._M_single_bucket,
                        (ulong)((long)&((var_assign.id_)->_M_h)._M_buckets + 1));
      }
      plVar3 = (long *)*plVar3;
    } while (plVar3 != (long *)0x0);
  }
  ids._M_h._M_single_bucket = (__node_base_ptr)&PTR_handle_002aa858;
  var_assign.super_ScopeVisitor._vptr_ScopeVisitor = (_func_int **)local_120;
  puVar4 = (this->modules_).
           super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->modules_).
           super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 != puVar1) {
    do {
      ScopeVisitor::visit((ScopeVisitor *)&ids._M_h._M_single_bucket,
                          (ScopeBase *)
                          (puVar4->_M_t).
                          super___uniq_ptr_impl<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_hgdb::json::Module_*,_std::default_delete<hgdb::json::Module>_>
                          .super__Head_base<0UL,_hgdb::json::Module_*,_false>._M_head_impl);
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar1);
  }
  std::
  _Hashtable<hgdb::json::Variable,_std::pair<const_hgdb::json::Variable,_unsigned_long>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<hgdb::json::Variable>,_hgdb::json::Variable::hash_fn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<hgdb::json::Variable,_std::pair<const_hgdb::json::Variable,_unsigned_long>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<hgdb::json::Variable>,_hgdb::json::Variable::hash_fn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_120);
  local_88._vptr_ScopeVisitor = (_func_int **)id;
  std::
  _Hashtable<hgdb::json::Variable,_std::pair<const_hgdb::json::Variable,_unsigned_long>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<hgdb::json::Variable>,_hgdb::json::Variable::hash_fn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<hgdb::json::Variable,_std::pair<const_hgdb::json::Variable,_unsigned_long>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<hgdb::json::Variable>,_hgdb::json::Variable::hash_fn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&v_count);
  return;
}

Assistant:

void compress_var() {
        // first pass collect all the variables
        VariableCount v_count;
        for (auto &m : modules_) {
            v_count.visit(m.get());
        }
        // compute the global variable pull
        variables_.reserve(v_count.count.size());
        std::unordered_map<Variable, uint64_t, Variable::hash_fn> ids;
        for (auto [var, c] : v_count.count) {
            if (c > 1) {
                auto id = variables_.size();
                auto &var_id = variables_.emplace_back(var);
                var_id.id = id;
                ids.emplace(var_id, id);
            }
        }

        // second pass to assign
        VarAssign var_assign(ids);
        for (auto &m : modules_) {
            var_assign.visit(m.get());
        }
    }